

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.h
# Opt level: O0

void gen_exception(TCGContext_conflict12 *tcg_ctx,int excp)

{
  TCGv_i32 arg2;
  TCGv_i32 tmp;
  int excp_local;
  TCGContext_conflict12 *tcg_ctx_local;
  
  arg2 = tcg_const_i32_s390x(tcg_ctx,excp);
  gen_helper_exception(tcg_ctx,tcg_ctx->cpu_env,arg2);
  tcg_temp_free_i32(tcg_ctx,arg2);
  return;
}

Assistant:

static inline void gen_exception(TCGContext *tcg_ctx, int excp, uint32_t syndrome,
                                 uint32_t target_el)
{
    TCGv_i32 tcg_excp = tcg_const_i32(tcg_ctx, excp);
    TCGv_i32 tcg_syn = tcg_const_i32(tcg_ctx, syndrome);
    TCGv_i32 tcg_el = tcg_const_i32(tcg_ctx, target_el);

    gen_helper_exception_with_syndrome(tcg_ctx, tcg_ctx->cpu_env, tcg_excp,
                                       tcg_syn, tcg_el);

    tcg_temp_free_i32(tcg_ctx, tcg_el);
    tcg_temp_free_i32(tcg_ctx, tcg_syn);
    tcg_temp_free_i32(tcg_ctx, tcg_excp);
}